

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O0

ImageInfo * __thiscall Diligent::ShaderResourcesGL::GetImage(ShaderResourcesGL *this,Uint32 Index)

{
  Char *Message;
  char (*in_R8) [18];
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  ShaderResourcesGL *this_local;
  
  msg.field_2._12_4_ = Index;
  if (this->m_NumImages <= Index) {
    FormatString<char[14],unsigned_int,char[18]>
              ((string *)local_38,(Diligent *)"Image index (",
               (char (*) [14])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x125);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_Images + (uint)msg.field_2._12_4_;
}

Assistant:

ImageInfo& GetImage(Uint32 Index)
    {
        VERIFY(Index < m_NumImages, "Image index (", Index, ") is out of range");
        return m_Images[Index];
    }